

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::DisposeObjects(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 local_8c [8];
  SuspendRecord __suspendRecord;
  AutoRestoreValue<bool> disableDispose;
  TrackAllocData oldAllocData;
  
  if (((this->allowDispose != true) || (this->hasDisposableObject != true)) ||
     (this->inDispose == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd27,
                       "(this->allowDispose && this->hasDisposableObject && !this->inDispose)",
                       "this->allowDispose && this->hasDisposableObject && !this->inDispose");
    if (!bVar3) goto LAB_00265958;
    *puVar1 = 0;
  }
  if (this->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd28,"(!isHeapEnumInProgress)","!isHeapEnumInProgress");
    if (!bVar3) goto LAB_00265958;
    *puVar1 = 0;
  }
  uVar4 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x10])
                    (this->collectionWrapper,local_8c);
  this->inDispose = true;
  oldAllocData.plusSize = 0;
  oldAllocData.count = 0;
  disableDispose.oldValue = false;
  disableDispose._17_7_ = 0;
  oldAllocData.typeinfo = (type_info *)0x0;
  oldAllocData.filename = (char *)0x0;
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    oldAllocData.filename = *(char **)&(this->nextAllocData).line;
    disableDispose._16_8_ = (this->nextAllocData).typeinfo;
    oldAllocData.typeinfo = (type_info *)(this->nextAllocData).plusSize;
    oldAllocData.plusSize = (this->nextAllocData).count;
    oldAllocData.count = (size_t)(this->nextAllocData).filename;
    (this->nextAllocData).typeinfo = (type_info *)0x0;
    (this->nextAllocData).plusSize = 0;
    (this->nextAllocData).count = 0;
  }
  bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
  if (bVar3) {
    Output::Print(L"Disposing objects\n");
  }
  this->allowDispose = false;
  __suspendRecord.phase[0x12]._0_1_ = AllPhase;
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xf])();
  HeapInfoManager::DisposeObjects(&this->autoHeap);
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    if ((((this->nextAllocData).typeinfo != (type_info *)0x0) ||
        ((this->nextAllocData).plusSize != 0)) || ((this->nextAllocData).count != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xd52,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
      if (!bVar3) goto LAB_00265958;
      *puVar1 = 0;
    }
    *(char **)&(this->nextAllocData).line = oldAllocData.filename;
    (this->nextAllocData).count = oldAllocData.plusSize;
    (this->nextAllocData).filename = (char *)oldAllocData.count;
    (this->nextAllocData).typeinfo = (type_info *)disableDispose._16_8_;
    (this->nextAllocData).plusSize = (size_t)oldAllocData.typeinfo;
  }
  if (this->inDispose == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xd57,"(this->inDispose)","this->inDispose");
    if (!bVar3) {
LAB_00265958:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this->inDispose = false;
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x11])
            (this->collectionWrapper,(ulong)(uVar4 & 0xff),local_8c);
  AutoRestoreValue<bool>::~AutoRestoreValue
            ((AutoRestoreValue<bool> *)(__suspendRecord.phase + 0x12));
  return;
}

Assistant:

void
Recycler::DisposeObjects()
{
    Assert(this->allowDispose && this->hasDisposableObject && !this->inDispose);
    Assert(!isHeapEnumInProgress);

    GCETW(GC_DISPOSE_START, (this));
    ASYNC_HOST_OPERATION_START(collectionWrapper);

    this->inDispose = true;

#ifdef PROFILE_RECYCLER_ALLOC
    // finalizer may allocate memory and dispose object can happen in the middle of allocation
    // save and restore the tracked object info
    TrackAllocData oldAllocData = { 0 };
    if (trackerDictionary != nullptr)
    {
        oldAllocData = nextAllocData;
        nextAllocData.Clear();
    }
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
    {
        Output::Print(_u("Disposing objects\n"));
    }
#endif

    // Disable dispose within this method, restore it when we're done
    AutoRestoreValue<bool> disableDispose(&this->allowDispose, false);

#ifdef FAULT_INJECTION
    this->collectionWrapper->DisposeScriptContextByFaultInjectionCallBack();
#endif
    this->collectionWrapper->PreDisposeObjectsCallBack();

    // Scope timestamp to just dispose
    {
        AUTO_TIMESTAMP(dispose);
        autoHeap.DisposeObjects();
    }

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty());
        nextAllocData = oldAllocData;
    }
#endif

    Assert(this->inDispose);

    this->inDispose = false;

    ASYNC_HOST_OPERATION_END(collectionWrapper);

    uint sweptBytes = 0;
#ifdef RECYCLER_STATS
    sweptBytes = (uint)collectionStats.objectSweptBytes;
#endif

    GCETW(GC_DISPOSE_STOP, (this, sweptBytes));
}